

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# View.cpp
# Opt level: O0

void __thiscall sf::View::View(View *this)

{
  Rect<float> local_20;
  View *local_10;
  View *this_local;
  
  local_10 = this;
  Vector2<float>::Vector2(&this->m_center);
  Vector2<float>::Vector2(&this->m_size);
  this->m_rotation = 0.0;
  Rect<float>::Rect(&this->m_viewport,0.0,0.0,1.0,1.0);
  Transform::Transform(&this->m_transform);
  Transform::Transform(&this->m_inverseTransform);
  this->m_transformUpdated = false;
  this->m_invTransformUpdated = false;
  Rect<float>::Rect(&local_20,0.0,0.0,1000.0,1000.0);
  reset(this,&local_20);
  return;
}

Assistant:

View::View() :
m_center             (),
m_size               (),
m_rotation           (0),
m_viewport           (0, 0, 1, 1),
m_transformUpdated   (false),
m_invTransformUpdated(false)
{
    reset(FloatRect(0, 0, 1000, 1000));
}